

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void ParseSmpl(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  DWORD DVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  undefined4 in_register_00000014;
  uint uVar4;
  pointer_____offset_0x10___ *ppuVar5;
  
  uVar4 = chunklen & 1;
  if (sf2->SampleDataOffset == 0) {
    if (uVar4 != 0) {
      uVar3 = __cxa_allocate_exception(1,uVar4,CONCAT44(in_register_00000014,chunkid));
      ppuVar5 = &CBadForm::typeinfo;
      goto LAB_00328a72;
    }
    DVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[3])(f);
    sf2->SampleDataOffset = DVar1;
    sf2->SizeSampleData = chunklen >> 1;
    uVar4 = 0;
  }
  iVar2 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[4])(f,(ulong)(uVar4 + chunklen),1);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    return;
  }
  uVar3 = __cxa_allocate_exception(1);
  ppuVar5 = &CIOErr::typeinfo;
LAB_00328a72:
  __cxa_throw(uVar3,ppuVar5,0);
}

Assistant:

static void ParseSmpl(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	// Only use the first smpl chunk. (Or should we reject files with more than one?)
	if (sf2->SampleDataOffset == 0)
	{
		if (chunklen & 1)
		{ // Chunk must be an even number of bytes.
			throw CBadForm();
		}
		sf2->SampleDataOffset = f->Tell();
		sf2->SizeSampleData = chunklen >> 1;
	}
	skip_chunk(f, chunklen);
}